

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O2

EVP_PKEY_CTX * EVP_PKEY_CTX_dup(EVP_PKEY_CTX *ctx)

{
  ENGINE *pEVar1;
  int iVar2;
  _Head_base<0UL,_evp_pkey_ctx_st_*,_false> _Var3;
  pointer __p;
  UniquePtr<EVP_PKEY_CTX> ret;
  
  if ((*(long *)ctx == 0) || (*(long *)(*(long *)ctx + 0x10) == 0)) {
    _Var3._M_head_impl = (evp_pkey_ctx_st *)0x0;
  }
  else {
    _Var3._M_head_impl = (evp_pkey_ctx_st *)OPENSSL_zalloc(0x30);
    ret._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)_Var3._M_head_impl;
    if ((tuple<evp_pkey_ctx_st_*,_bssl::internal::Deleter>)_Var3._M_head_impl ==
        (_Head_base<0UL,_evp_pkey_ctx_st_*,_false>)0x0) {
      _Var3._M_head_impl = (evp_pkey_ctx_st *)0x0;
    }
    else {
      pEVar1 = *(ENGINE **)(ctx + 8);
      (_Var3._M_head_impl)->pmeth = *(EVP_PKEY_METHOD **)ctx;
      (_Var3._M_head_impl)->engine = pEVar1;
      (_Var3._M_head_impl)->operation = *(int *)(ctx + 0x20);
      if (*(EVP_PKEY **)(ctx + 0x10) != (EVP_PKEY *)0x0) {
        EVP_PKEY_up_ref(*(EVP_PKEY **)(ctx + 0x10));
        (_Var3._M_head_impl)->pkey = *(EVP_PKEY **)(ctx + 0x10);
      }
      if (*(EVP_PKEY **)(ctx + 0x18) != (EVP_PKEY *)0x0) {
        EVP_PKEY_up_ref(*(EVP_PKEY **)(ctx + 0x18));
        (_Var3._M_head_impl)->peerkey = *(EVP_PKEY **)(ctx + 0x18);
      }
      iVar2 = (**(code **)(*(long *)ctx + 0x10))(_Var3._M_head_impl);
      if (iVar2 < 1) {
        (_Var3._M_head_impl)->pmeth = (EVP_PKEY_METHOD *)0x0;
        _Var3._M_head_impl = (evp_pkey_ctx_st *)0x0;
        ERR_put_error(6,0,6,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                      ,0x88);
      }
      else {
        ret._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0;
      }
    }
    std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ret);
  }
  return (EVP_PKEY_CTX *)_Var3._M_head_impl;
}

Assistant:

EVP_PKEY_CTX *EVP_PKEY_CTX_dup(EVP_PKEY_CTX *ctx) {
  if (!ctx->pmeth || !ctx->pmeth->copy) {
    return nullptr;
  }

  bssl::UniquePtr<EVP_PKEY_CTX> ret(
      reinterpret_cast<EVP_PKEY_CTX *>(OPENSSL_zalloc(sizeof(EVP_PKEY_CTX))));
  if (!ret) {
    return nullptr;
  }

  ret->pmeth = ctx->pmeth;
  ret->engine = ctx->engine;
  ret->operation = ctx->operation;

  if (ctx->pkey != nullptr) {
    EVP_PKEY_up_ref(ctx->pkey);
    ret->pkey = ctx->pkey;
  }

  if (ctx->peerkey != nullptr) {
    EVP_PKEY_up_ref(ctx->peerkey);
    ret->peerkey = ctx->peerkey;
  }

  if (ctx->pmeth->copy(ret.get(), ctx) <= 0) {
    ret->pmeth = nullptr;
    OPENSSL_PUT_ERROR(EVP, ERR_LIB_EVP);
    return nullptr;
  }

  return ret.release();
}